

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O2

int pfx_table_copy_except_socket(pfx_table *src_table,pfx_table *dst_table,rtr_socket *socket)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  copy_cb_args args;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  args.error = false;
  args.pfx_table = dst_table;
  args.socket = socket;
  pfx_table_for_each_ipv4_record(src_table,pfx_table_copy_cb,&args);
  if (args.error == false) {
    pfx_table_for_each_ipv6_record(src_table,pfx_table_copy_cb,&args);
    iVar2 = -(uint)args.error;
  }
  else {
    iVar2 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int pfx_table_copy_except_socket(struct pfx_table *src_table, struct pfx_table *dst_table,
				 const struct rtr_socket *socket)
{
	struct copy_cb_args args = {dst_table, socket, false};

	pfx_table_for_each_ipv4_record(src_table, pfx_table_copy_cb, &args);
	if (args.error)
		return PFX_ERROR;

	pfx_table_for_each_ipv6_record(src_table, pfx_table_copy_cb, &args);
	if (args.error)
		return PFX_ERROR;

	return PFX_SUCCESS;
}